

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_DataStructures_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00745b18 == '\x01') {
    DAT_00745b18 = '\0';
    (*(code *)*_StringToInt64Map_default_instance_)();
  }
  if (DAT_00745b90 == '\x01') {
    DAT_00745b90 = '\0';
    (*(code *)*_Int64ToStringMap_default_instance_)();
  }
  if (DAT_00745c08 == '\x01') {
    DAT_00745c08 = '\0';
    (*(code *)*_StringToDoubleMap_default_instance_)();
  }
  if (DAT_00745c80 == '\x01') {
    DAT_00745c80 = '\0';
    (*(code *)*_Int64ToDoubleMap_default_instance_)();
  }
  if (DAT_00745cb8 == '\x01') {
    DAT_00745cb8 = '\0';
    (*(code *)*_StringVector_default_instance_)();
  }
  if (DAT_00745ce8 == '\x01') {
    DAT_00745ce8 = '\0';
    (*(code *)*_Int64Vector_default_instance_)();
  }
  if (DAT_00745d18 == '\x01') {
    DAT_00745d18 = '\0';
    (*(code *)*_FloatVector_default_instance_)();
  }
  if (DAT_00745d48 == '\x01') {
    DAT_00745d48 = '\0';
    (*(code *)*_DoubleVector_default_instance_)();
  }
  if (DAT_00745d78 == '\x01') {
    DAT_00745d78 = '\0';
    (*(code *)*_Int64Range_default_instance_)();
  }
  if (DAT_00745da8 == '\x01') {
    DAT_00745da8 = '\0';
    (*(code *)*_Int64Set_default_instance_)();
  }
  if (DAT_00745dd8 == '\x01') {
    DAT_00745dd8 = 0;
    (*(code *)*_DoubleRange_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _StringToInt64Map_default_instance_.Shutdown();
  _Int64ToStringMap_default_instance_.Shutdown();
  _StringToDoubleMap_default_instance_.Shutdown();
  _Int64ToDoubleMap_default_instance_.Shutdown();
  _StringVector_default_instance_.Shutdown();
  _Int64Vector_default_instance_.Shutdown();
  _FloatVector_default_instance_.Shutdown();
  _DoubleVector_default_instance_.Shutdown();
  _Int64Range_default_instance_.Shutdown();
  _Int64Set_default_instance_.Shutdown();
  _DoubleRange_default_instance_.Shutdown();
}